

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squtils.h
# Opt level: O0

void __thiscall
sqvector<SQObjectPtr>::insert(sqvector<SQObjectPtr> *this,SQUnsignedInteger idx,SQObjectPtr *val)

{
  SQObjectPtr *pSVar1;
  SQObjectPtr *in_RSI;
  long in_RDI;
  SQUnsignedInteger i;
  SQObjectPtr *this_00;
  sqvector<SQObjectPtr> *in_stack_ffffffffffffffc0;
  SQObjectPtr local_28;
  SQObjectPtr *local_10;
  
  pSVar1 = (SQObjectPtr *)(*(long *)(in_RDI + 8) + 1);
  this_00 = &local_28;
  local_10 = in_RSI;
  ::SQObjectPtr::SQObjectPtr(this_00);
  resize(in_stack_ffffffffffffffc0,(SQUnsignedInteger)this_00,pSVar1);
  ::SQObjectPtr::~SQObjectPtr(pSVar1);
  pSVar1 = *(SQObjectPtr **)(in_RDI + 8);
  while (pSVar1 = (SQObjectPtr *)((long)&pSVar1[-1].super_SQObject._unVal + 7), local_10 < pSVar1) {
    ::SQObjectPtr::operator=(pSVar1,this_00);
  }
  ::SQObjectPtr::operator=(pSVar1,this_00);
  return;
}

Assistant:

void insert(SQUnsignedInteger idx, const T& val)
    {
        resize(_size + 1);
        for(SQUnsignedInteger i = _size - 1; i > idx; i--) {
            _vals[i] = _vals[i - 1];
        }
        _vals[idx] = val;
    }